

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_DeleteProperty(JSContext *ctx,JSValue obj,JSAtom prop,int flags)

{
  JSStackFrame *pJVar1;
  int iVar2;
  JSValue v;
  
  v = JS_ToObject(ctx,obj);
  if ((int)v.tag != 6) {
    iVar2 = delete_property(ctx,(JSObject *)v.u.ptr,prop);
    JS_FreeValue(ctx,v);
    if (iVar2 != 0) {
      return iVar2;
    }
    if (((uint)flags >> 0xe & 1) == 0) {
      if (-1 < (short)flags) {
        return 0;
      }
      pJVar1 = ctx->rt->current_stack_frame;
      if (pJVar1 == (JSStackFrame *)0x0) {
        return 0;
      }
      if ((pJVar1->js_mode & 1) == 0) {
        return 0;
      }
    }
    JS_ThrowTypeError(ctx,"could not delete property");
  }
  return -1;
}

Assistant:

int JS_DeleteProperty(JSContext *ctx, JSValueConst obj, JSAtom prop, int flags)
{
    JSValue obj1;
    JSObject *p;
    int res;
    
    obj1 = JS_ToObject(ctx, obj);
    if (JS_IsException(obj1))
        return -1;
    p = JS_VALUE_GET_OBJ(obj1);
    res = delete_property(ctx, p, prop);
    JS_FreeValue(ctx, obj1);
    if (res != FALSE)
        return res;
    if ((flags & JS_PROP_THROW) ||
        ((flags & JS_PROP_THROW_STRICT) && is_strict_mode(ctx))) {
        JS_ThrowTypeError(ctx, "could not delete property");
        return -1;
    }
    return FALSE;
}